

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

CTransactionRef __thiscall
TxPackageTest::create_placeholder_tx(TxPackageTest *this,size_t num_inputs,size_t num_outputs)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  CScript *pCVar1;
  reference pvVar2;
  reference pvVar3;
  ulong in_RCX;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  CTransactionRef CVar4;
  size_t o;
  size_t i;
  CMutableTransaction mtx;
  CScript random_script;
  CMutableTransaction *in_stack_fffffffffffffe08;
  CMutableTransaction *in_stack_fffffffffffffe10;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffe18;
  size_type in_stack_fffffffffffffe20;
  CScript *in_stack_fffffffffffffe28;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffe38;
  RandomMixin<FastRandomContext> *this_00;
  pointer in_stack_fffffffffffffe40;
  __extent_storage<18446744073709551615UL> in;
  ulong local_190;
  ulong local_188;
  CScript local_e8 [2];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  RandomMixin<FastRandomContext> local_88 [2];
  uint256 local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffffe08);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffffe08);
  in._M_extent_value = (size_t)&local_68;
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffffe38);
  ToByteVector<uint256>((uint256 *)in._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffe18,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe10);
  b._M_extent._M_extent_value = in._M_extent_value;
  b._M_ptr = in_stack_fffffffffffffe40;
  pCVar1 = CScript::operator<<(in_stack_fffffffffffffe28,b);
  this_00 = local_88;
  RandomMixin<FastRandomContext>::rand256(this_00);
  ToByteVector<uint256>((uint256 *)in._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffe18,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe10);
  b_00._M_extent._M_extent_value = in._M_extent_value;
  b_00._M_ptr = (pointer)pCVar1;
  CScript::operator<<(in_stack_fffffffffffffe28,b_00);
  CScript::CScript((CScript *)in_stack_fffffffffffffe08,(CScript *)0xb86ac8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe18);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe08);
  for (local_188 = 0; local_188 < in_RDX; local_188 = local_188 + 1) {
    RandomMixin<FastRandomContext>::rand256(this_00);
    transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffffe08);
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe18,
                        (size_type)in_stack_fffffffffffffe10);
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_98;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uStack_90;
    *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_a8
    ;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_a0;
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe18,
                        (size_type)in_stack_fffffffffffffe10);
    (pvVar2->prevout).n = 0;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe18,
               (size_type)in_stack_fffffffffffffe10);
    CScript::operator=((CScript *)in_stack_fffffffffffffe18,(CScript *)in_stack_fffffffffffffe10);
  }
  for (local_190 = 0; local_190 < in_RCX; local_190 = local_190 + 1) {
    pCVar1 = local_e8;
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)pCVar1,
                        (size_type)in_stack_fffffffffffffe10);
    pvVar3->nValue = 1000000;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)pCVar1,
               (size_type)in_stack_fffffffffffffe10);
    CScript::operator=(pCVar1,(CScript *)in_stack_fffffffffffffe10);
  }
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffe10);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe08);
  CMutableTransaction::~CMutableTransaction(in_stack_fffffffffffffe08);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (CTransactionRef)CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

inline CTransactionRef create_placeholder_tx(size_t num_inputs, size_t num_outputs)
{
    CMutableTransaction mtx = CMutableTransaction();
    mtx.vin.resize(num_inputs);
    mtx.vout.resize(num_outputs);
    auto random_script = CScript() << ToByteVector(m_rng.rand256()) << ToByteVector(m_rng.rand256());
    for (size_t i{0}; i < num_inputs; ++i) {
        mtx.vin[i].prevout.hash = Txid::FromUint256(m_rng.rand256());
        mtx.vin[i].prevout.n = 0;
        mtx.vin[i].scriptSig = random_script;
    }
    for (size_t o{0}; o < num_outputs; ++o) {
        mtx.vout[o].nValue = 1 * CENT;
        mtx.vout[o].scriptPubKey = random_script;
    }
    return MakeTransactionRef(mtx);
}